

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBScene.h
# Opt level: O3

void __thiscall Assimp::COB::Node::~Node(Node *this)

{
  pointer pcVar1;
  
  this->_vptr_Node = (_func_int **)&PTR__Node_00878ac0;
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
  }
  std::_Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>::
  ~_Deque_base(&(this->temp_children).
                super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
              );
  return;
}

Assistant:

virtual ~Node() {}